

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O2

void predict_or_learn<true,true>(cbify *data,single_learner *base,example *ec)

{
  size_t sVar1;
  label_t lVar2;
  cb_class *pcVar3;
  action_score *paVar4;
  action_score *paVar5;
  int iVar6;
  vw_exception *pvVar7;
  uint32_t chosen_action;
  single_learner *local_250;
  cb_class cl;
  label csl;
  string local_218;
  string local_1f8;
  score_iterator local_1d8;
  score_iterator local_1c8;
  stringstream __msg;
  ostream local_1a8;
  
  csl.costs._begin = (ec->l).cs.costs._begin;
  csl.costs._end = (ec->l).cs.costs._end;
  csl.costs.end_array = (ec->l).cs.costs.end_array;
  csl.costs.erase_count = (ec->l).cs.costs.erase_count;
  v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)data);
  lVar2 = (label_t)(data->cb_label).costs._begin;
  pcVar3 = (data->cb_label).costs._end;
  sVar1 = (data->cb_label).costs.erase_count;
  (ec->l).cs.costs.end_array = (wclass *)(data->cb_label).costs.end_array;
  (ec->l).cs.costs.erase_count = sVar1;
  (ec->l).multi = lVar2;
  (ec->l).cs.costs._end = (wclass *)pcVar3;
  paVar4 = (data->a_s)._end;
  paVar5 = (data->a_s).end_array;
  sVar1 = (data->a_s).erase_count;
  (ec->pred).scalars._begin = (float *)(data->a_s)._begin;
  (ec->pred).scalars._end = (float *)paVar4;
  (ec->pred).scalars.end_array = (float *)paVar5;
  (ec->pred).scalars.erase_count = sVar1;
  LEARNER::learner<char,_example>::predict(base,ec,0);
  sVar1 = data->example_counter;
  data->example_counter = sVar1 + 1;
  local_1c8._p = (action_score *)(ec->pred).scalars._begin;
  local_1c8._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_1d8._p = (action_score *)(ec->pred).scalars._end;
  local_1d8._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  iVar6 = exploration::sample_after_normalizing<ACTION_SCORE::score_iterator>
                    (sVar1 + data->app_seed,&local_1c8,&local_1d8,&chosen_action);
  if (iVar6 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    std::operator<<(&local_1a8,"Failed to sample from pdf");
    pvVar7 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar7,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cbify.cc"
               ,0xa4,&local_1f8);
    __cxa_throw(pvVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  cl.action = chosen_action + 1;
  cl.probability = (ec->pred).a_s._begin[chosen_action].score;
  local_250 = base;
  if (cl.action != 0) {
    cl.cost = loss_cs(data,&csl.costs,cl.action);
    v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)data,&cl);
    lVar2 = (label_t)(data->cb_label).costs._begin;
    pcVar3 = (data->cb_label).costs._end;
    sVar1 = (data->cb_label).costs.erase_count;
    (ec->l).cs.costs.end_array = (wclass *)(data->cb_label).costs.end_array;
    (ec->l).cs.costs.erase_count = sVar1;
    (ec->l).multi = lVar2;
    (ec->l).cs.costs._end = (wclass *)pcVar3;
    LEARNER::learner<char,_example>::learn(local_250,ec,0);
    v_array<ACTION_SCORE::action_score>::clear(&data->a_s);
    paVar4 = (action_score *)(ec->pred).scalars._begin;
    paVar5 = (action_score *)(ec->pred).scalars._end;
    sVar1 = (ec->pred).scalars.erase_count;
    (data->a_s).end_array = (action_score *)(ec->pred).scalars.end_array;
    (data->a_s).erase_count = sVar1;
    (data->a_s)._begin = paVar4;
    (data->a_s)._end = paVar5;
    (ec->l).cs.costs.end_array = csl.costs.end_array;
    (ec->l).cs.costs.erase_count = csl.costs.erase_count;
    (ec->l).cs.costs._begin = csl.costs._begin;
    (ec->l).cs.costs._end = csl.costs._end;
    (ec->pred).multiclass = cl.action;
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  std::operator<<(&local_1a8,"No action with non-zero probability found!");
  pvVar7 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (pvVar7,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cbify.cc"
             ,0xab,&local_218);
  __cxa_throw(pvVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void predict_or_learn(cbify& data, single_learner& base, example& ec)
{
  // Store the multiclass or cost-sensitive input label
  MULTICLASS::label_t ld;
  COST_SENSITIVE::label csl;
  if (use_cs)
    csl = ec.l.cs;
  else
    ld = ec.l.multi;

  data.cb_label.costs.clear();
  ec.l.cb = data.cb_label;
  ec.pred.a_s = data.a_s;

  // Call the cb_explore algorithm. It returns a vector of probabilities for each action
  base.predict(ec);
  // data.probs = ec.pred.scalars;

  uint32_t chosen_action;
  if (sample_after_normalizing(
          data.app_seed + data.example_counter++, begin_scores(ec.pred.a_s), end_scores(ec.pred.a_s), chosen_action))
    THROW("Failed to sample from pdf");

  CB::cb_class cl;
  cl.action = chosen_action + 1;
  cl.probability = ec.pred.a_s[chosen_action].score;

  if (!cl.action)
    THROW("No action with non-zero probability found!");
  if (use_cs)
    cl.cost = loss_cs(data, csl.costs, cl.action);
  else
    cl.cost = loss(data, ld.label, cl.action);

  // Create a new cb label
  data.cb_label.costs.push_back(cl);
  ec.l.cb = data.cb_label;

  if (is_learn)
    base.learn(ec);

  data.a_s.clear();
  data.a_s = ec.pred.a_s;

  if (use_cs)
    ec.l.cs = csl;
  else
    ec.l.multi = ld;

  ec.pred.multiclass = cl.action;
}